

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::StartTestCase(XmlReporter *this,TestCaseInfo *testInfo)

{
  XmlWriter *this_00;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  TestCaseInfo *local_18;
  TestCaseInfo *testInfo_local;
  XmlReporter *this_local;
  
  local_18 = testInfo;
  testInfo_local = (TestCaseInfo *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"TestCase",&local_39);
  this_00 = XmlWriter::startElement(&this->m_xml,(string *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"name",&local_71);
  XmlWriter::writeAttribute(this_00,(string *)local_70,&local_18->name);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  this->m_currentTestSuccess = true;
  return;
}

Assistant:

virtual void StartTestCase( const Catch::TestCaseInfo& testInfo ) {
            m_xml.startElement( "TestCase" ).writeAttribute( "name", testInfo.name );
            m_currentTestSuccess = true;
        }